

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SignalBenchmarks.hpp
# Opt level: O1

void benchmarks::SignalBenchmarks<descriptors::signal::wigwag::Ui>::Invoke
               (BenchmarkContext *context,int64_t numSlots)

{
  int64_t *piVar1;
  ulong uVar2;
  __sighandler_t extraout_RDX;
  __sighandler_t extraout_RDX_00;
  __sighandler_t __handler;
  int __sig;
  long lVar3;
  SignalType s;
  StorageArray<wigwag::token> c;
  HandlerType handler;
  IOperationProfilerPtr op;
  SignalType local_90;
  StorageArray<wigwag::token> local_88;
  _Any_data local_78;
  code *local_68;
  code *local_60;
  anon_class_16_2_8e986c60 local_50;
  SignalType local_40 [2];
  undefined1 local_30 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_28;
  
  lVar3 = context->_iterationsCount;
  local_78._M_unused._M_object = (void *)0x0;
  local_78._8_8_ = 0;
  local_60 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/koplyarov[P]wigwag/src/benchmarks/descriptors/signal/wigwag.hpp:36:45)>
             ::_M_invoke;
  local_68 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/koplyarov[P]wigwag/src/benchmarks/descriptors/signal/wigwag.hpp:36:45)>
             ::_M_manager;
  local_90._impl._s._ptr._raw =
       (creation_storage_adapter<wigwag::creation::lazy::storage<wigwag::detail::intrusive_ptr<wigwag::detail::signal_impl<void_(),_wigwag::exception_handling::none,_wigwag::threading::none,_wigwag::state_populating::none,_wigwag::life_assurance::none,_wigwag::ref_counter::single_threaded>_>,_wigwag::detail::signal_impl<void_(),_wigwag::exception_handling::none,_wigwag::threading::none,_wigwag::state_populating::none,_wigwag::life_assurance::none,_wigwag::ref_counter::single_threaded>_>_>
        )(storage<wigwag::detail::intrusive_ptr<wigwag::detail::signal_impl<void_(),_wigwag::exception_handling::none,_wigwag::threading::none,_wigwag::state_populating::none,_wigwag::life_assurance::none,_wigwag::ref_counter::single_threaded>_>,_wigwag::detail::signal_impl<void_(),_wigwag::exception_handling::none,_wigwag::threading::none,_wigwag::state_populating::none,_wigwag::life_assurance::none,_wigwag::ref_counter::single_threaded>_>
          )0x0;
  uVar2 = 0xffffffffffffffff;
  if ((ulong)(numSlots * 8) < 0xfffffffffffffff8) {
    uVar2 = numSlots * 8 + 8;
  }
  local_88._size = numSlots;
  piVar1 = (int64_t *)operator_new__(-(ulong)((ulong)numSlots >> 0x3d != 0) | uVar2);
  *piVar1 = numSlots;
  local_88._arr = (Storage<wigwag::token> *)(piVar1 + 1);
  local_50.s = &local_90;
  local_50.handler = (HandlerType *)&local_78;
  StorageArray<wigwag::token>::
  Construct<benchmarks::SignalBenchmarks<descriptors::signal::wigwag::Ui>::Invoke(benchmarks::BenchmarkContext&,long)::_lambda()_1_>
            (&local_88,&local_50);
  local_50.s = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"invoke","");
  (*context->_vptr_BenchmarkContext[3])(local_30,context,&local_50,numSlots * lVar3);
  if (local_50.s != local_40) {
    operator_delete(local_50.s);
  }
  __sig = (int)context;
  if (0 < lVar3) {
    do {
      wigwag::
      signal<void_(),_wigwag::exception_handling::none,_wigwag::threading::none,_wigwag::state_populating::none,_wigwag::life_assurance::none,_wigwag::creation::lazy,_wigwag::ref_counter::single_threaded>
      ::operator()(&local_90);
      __sig = (int)context;
      lVar3 = lVar3 + -1;
    } while (lVar3 != 0);
  }
  if (local_28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28);
  }
  StorageArray<wigwag::token>::Destruct(&local_88);
  __handler = extraout_RDX;
  if (local_88._arr != (Storage<wigwag::token> *)0x0) {
    operator_delete__(local_88._arr + -1);
    __handler = extraout_RDX_00;
  }
  wigwag::
  signal<void_(),_wigwag::exception_handling::none,_wigwag::threading::none,_wigwag::state_populating::none,_wigwag::life_assurance::none,_wigwag::creation::lazy,_wigwag::ref_counter::single_threaded>
  ::~signal(&local_90,__sig,__handler);
  if (local_68 != (code *)0x0) {
    (*local_68)(&local_78,&local_78,__destroy_functor);
  }
  return;
}

Assistant:

static void Invoke(BenchmarkContext& context, int64_t numSlots)
        {
            const auto n = context.GetIterationsCount();

            HandlerType handler = SignalsDesc_::MakeHandler();
            SignalType s;
            StorageArray<ConnectionType> c(numSlots);

            c.Construct([&]{ return s.connect(handler); });

            {
                auto op = context.Profile("invoke", numSlots * n);
                for (int64_t i = 0; i < n; ++i)
                    s();
            }

            c.Destruct();
        }